

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O3

void __thiscall
antlr::BaseAST::doWorkForFindAll
          (BaseAST *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *v,RefAST *target,bool partialMatch)

{
  AST *pAVar1;
  ASTRef *pAVar2;
  char cVar3;
  BaseAST *this_00;
  ASTRefCount<antlr::AST> *pAVar5;
  RefAST sibling;
  ASTRefCount<antlr::AST> local_68;
  ASTRefCount<antlr::AST> local_60;
  ASTRefCount<antlr::AST> local_58;
  ASTRefCount<antlr::AST> local_50;
  uint local_44;
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38;
  int iVar4;
  
  local_68.ref = ASTRef::getRef(&this->super_AST);
  if (local_68.ref != (ASTRef *)0x0) {
    local_44 = (uint)partialMatch;
    do {
      pAVar5 = &local_50;
      pAVar1 = (local_68.ref)->ptr;
      if (pAVar1 == (AST *)0x0) break;
      pAVar2 = target->ref;
      if (partialMatch) {
        if (pAVar2 != (ASTRef *)0x0) {
          pAVar2->count = pAVar2->count + 1;
        }
        local_50.ref = pAVar2;
        iVar4 = (*pAVar1->_vptr_AST[8])(pAVar1,pAVar5);
        cVar3 = (char)iVar4;
      }
      else {
        if (pAVar2 != (ASTRef *)0x0) {
          pAVar2->count = pAVar2->count + 1;
        }
        pAVar5 = &local_38;
        local_38.ref = pAVar2;
        iVar4 = (*pAVar1->_vptr_AST[7])(pAVar1,pAVar5);
        cVar3 = (char)iVar4;
      }
      ASTRefCount<antlr::AST>::~ASTRefCount(pAVar5);
      if (cVar3 != '\0') {
        std::
        vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
        push_back(v,&local_68);
      }
      (*(local_68.ref)->ptr->_vptr_AST[0xd])(&local_60);
      pAVar5 = &local_60;
      if (local_60.ref == (ASTRef *)0x0) {
LAB_001524a7:
        ASTRefCount<antlr::AST>::~ASTRefCount(pAVar5);
      }
      else {
        pAVar1 = (local_60.ref)->ptr;
        ASTRefCount<antlr::AST>::~ASTRefCount(&local_60);
        if (pAVar1 != (AST *)0x0) {
          (*(local_68.ref)->ptr->_vptr_AST[0xd])();
          if ((local_58.ref == (ASTRef *)0x0) || ((local_58.ref)->ptr == (AST *)0x0)) {
            local_60.ref = (ASTRef *)0x0;
LAB_00152471:
            this_00 = (BaseAST *)0x0;
          }
          else {
            local_60.ref = ASTRef::getRef((local_58.ref)->ptr);
            if (local_60.ref == (ASTRef *)0x0) goto LAB_00152471;
            this_00 = (BaseAST *)(local_60.ref)->ptr;
          }
          local_40.ref = target->ref;
          if (local_40.ref != (ASTRef *)0x0) {
            (local_40.ref)->count = (local_40.ref)->count + 1;
          }
          doWorkForFindAll(this_00,v,&local_40,SUB41(local_44,0));
          ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
          ASTRefCount<antlr::BaseAST>::~ASTRefCount((ASTRefCount<antlr::BaseAST> *)&local_60);
          pAVar5 = &local_58;
          goto LAB_001524a7;
        }
      }
      (*(local_68.ref)->ptr->_vptr_AST[0xe])(&local_60);
      ASTRefCount<antlr::AST>::operator=(&local_68,&local_60);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_60);
    } while (local_68.ref != (ASTRef *)0x0);
  }
  ASTRefCount<antlr::AST>::~ASTRefCount(&local_68);
  return;
}

Assistant:

void BaseAST::doWorkForFindAll(
		ANTLR_USE_NAMESPACE(std)vector<RefAST>& v,
		RefAST target,bool partialMatch)
{
	// Start walking sibling lists, looking for matches.
	for (RefAST sibling=this;
			sibling;
			sibling=sibling->getNextSibling())
	{
		if ( (partialMatch && sibling->equalsTreePartial(target)) ||
				(!partialMatch && sibling->equalsTree(target)) ) {
			v.push_back(sibling);
		}
		// regardless of match or not, check any children for matches
		if ( sibling->getFirstChild() ) {
			RefBaseAST(sibling->getFirstChild())->doWorkForFindAll(v, target, partialMatch);
		}
	}
}